

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ufs.c
# Opt level: O3

int quote_fname_ufs(char *file)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  byte *pbVar4;
  long lVar5;
  byte *pbVar6;
  bool bVar7;
  char fbuf [256];
  byte local_108 [264];
  
  pbVar2 = local_108;
  pbVar3 = local_108;
  pbVar4 = (byte *)file;
  do {
    bVar1 = *pbVar4;
    lVar5 = 1;
    pbVar6 = pbVar2;
    if (bVar1 < 0x3b) {
      if (bVar1 == 0x27) goto LAB_00137419;
      if (bVar1 == 0) break;
    }
    else if ((bVar1 == 0x3e) || (bVar1 == 0x3b)) {
LAB_00137419:
      *pbVar2 = 0x27;
      lVar5 = 2;
      pbVar6 = pbVar2 + 1;
    }
    pbVar2 = pbVar2 + lVar5;
    *pbVar6 = bVar1;
    pbVar4 = pbVar4 + 1;
  } while( true );
  *pbVar2 = 0;
  pbVar4 = local_108;
  if (local_108[0] != 0) {
    do {
      pbVar4 = pbVar3 + 1;
      bVar7 = true;
      if (local_108[0] == 0x27) {
        if (pbVar3[1] != 0) {
          pbVar4 = pbVar3 + 2;
        }
      }
      else if (local_108[0] == 0x2e) {
        bVar7 = *pbVar4 == 0;
      }
      pbVar3 = pbVar4;
      local_108[0] = *pbVar3;
    } while ((local_108[0] != 0) && (bVar7));
    pbVar4 = pbVar3;
    if (!bVar7) goto LAB_00137492;
  }
  if (pbVar4[-1] == 0x2e) {
    pbVar4[-1] = 0x27;
    pbVar4[0] = 0x2e;
    pbVar4 = pbVar4 + 1;
  }
  pbVar4[0] = 0x2e;
  pbVar4[1] = 0;
LAB_00137492:
  strcpy(file,(char *)local_108);
  return 1;
}

Assistant:

int quote_fname_ufs(char *file)
{
  char *cp, *dp;
  int extensionp;
  char fbuf[MAXNAMLEN + 1];

  cp = file;
  dp = fbuf;

  while (*cp) {
    switch (*cp) {
      case '>':
      case ';':
      case '\'':
        *dp++ = '\'';
        *dp++ = *cp++;
        break;

      default: *dp++ = *cp++; break;
    }
  }
  *dp = '\0';

  /*
   * extensionp indicates whether extension field is included in a file
   * name or not.  If extension field is not included, we have to add a
   * period to specify empty extension field.
   */
  cp = fbuf;
  extensionp = 0;
  while (*cp && !extensionp) {
    switch (*cp) {
      case '.':
        if (*(cp + 1)) extensionp = 1;
        cp++;
        break;

      case '\'':
        if (*(cp + 1) != '\0')
          cp += 2;
        else
          cp++;
        break;

      default: cp++; break;
    }
  }
  if (!extensionp) {
    if (*(cp - 1) == '.') {
      *(cp - 1) = '\'';
      *cp++ = '.';
    }
    *cp++ = '.';
    *cp = '\0';
  }
  strcpy(file, fbuf);
  return (1);
}